

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_usage(FILE *stream,char *prog)

{
  char *prog_local;
  FILE *stream_local;
  
  fprintf((FILE *)stream,
          "Usage: %s [-h] [-l length] [-t time] [-T step] <secret>\n  -h          Print this help message and quit\n  -l length   Set the password length. Defaults to %d, max is %d\n  -t time     Set the time. Defaults to current time\n  -T step     Set time step. Defaults to %d\n"
          ,prog,8,0xc,0x1e);
  return;
}

Assistant:

static void print_usage(FILE *stream, const char *prog) {
  fprintf(stream,
          "Usage: %s [-h] [-l length] [-t time] [-T step] <secret>\n"
          "  -h          Print this help message and quit\n"
          "  -l length   Set the password length. Defaults to %d, max is %d\n"
          "  -t time     Set the time. Defaults to current time\n"
          "  -T step     Set time step. Defaults to %d\n",
          prog, OTP_DEFAULT_LENGTH, OTP_MAX_LENGTH, TIME_STEP_DEFAULT);
}